

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O0

void __thiscall Code::generateMeasError(Code *this)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  set<int,_std::less<int>,_std::allocator<int>_> *in_RDI;
  result_type_conflict2 rVar4;
  iterator it;
  int imax;
  int i;
  engine<unsigned_int,_unsigned_long,_pcg_detail::xsh_rr_mixin<unsigned_int,_unsigned_long>,_true,_pcg_detail::specific_stream<unsigned_long>,_pcg_detail::default_multiplier<unsigned_long>_>
  *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  value_type in_stack_ffffffffffffffd7;
  _Self local_20;
  _Self local_18;
  int local_10;
  int local_c;
  
  local_c = 0;
  sVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::size
                    ((vector<signed_char,_std::allocator<signed_char>_> *)
                     &(in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left);
  local_10 = (int)sVar2;
  do {
    if (local_10 <= local_c) {
      return;
    }
    if (((ulong)in_RDI[6]._M_t._M_impl.super__Rb_tree_header._M_header._M_left & 1) == 0) {
LAB_00135b28:
      rVar4 = std::uniform_real_distribution<double>::operator()
                        ((uniform_real_distribution<double> *)
                         CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffc8);
      if (rVar4 <= (double)in_RDI[6]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        pvVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)
                            &(in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                            (long)local_c);
        in_stack_ffffffffffffffd7 = (value_type)((*pvVar3 + 1) % 2);
        pvVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)
                            &(in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                            (long)local_c);
        *pvVar3 = in_stack_ffffffffffffffd7;
      }
    }
    else {
      local_18._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::find
                     (in_RDI,(key_type *)
                             CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
      local_20._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffffc8);
      bVar1 = std::operator==(&local_18,&local_20);
      if (!bVar1) goto LAB_00135b28;
    }
    local_c = local_c + 1;
  } while( true );
}

Assistant:

void Code::generateMeasError()
{
    for (int i = 0, imax = syndrome.size() ; i < imax; ++i)
    {
        if (boundaries)
        {
            auto it = syndromeIndices.find(i);
            if (it == syndromeIndices.end())
            {
                continue;
            }
        }
        if (distDouble0To1(rnEngine) <= q)
        {
            syndrome[i] = (syndrome[i] + 1) % 2;
        }
    }
}